

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cellml_1_0.cpp
# Opt level: O0

void __thiscall
ParserTransform_hodgkinHuxleyCellml10_Test::~ParserTransform_hodgkinHuxleyCellml10_Test
          (ParserTransform_hodgkinHuxleyCellml10_Test *this)

{
  ParserTransform_hodgkinHuxleyCellml10_Test *this_local;
  
  ~ParserTransform_hodgkinHuxleyCellml10_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ParserTransform, hodgkinHuxleyCellml10)
{
    libcellml::ParserPtr parser = libcellml::Parser::create(false);
    auto model = parser->parseModel(fileContents("cellml1X/Hodgkin_Huxley_1952_modified.cellml"));

    EXPECT_EQ(size_t(7), model->unitsCount());
    EXPECT_EQ(size_t(5), model->componentCount());
    EXPECT_EQ(size_t(4), parser->issueCount());

    auto validator = libcellml::Validator::create();
    validator->validateModel(model);

    EXPECT_EQ(size_t(0), validator->issueCount());
}